

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::InstanceArraySymbol::serializeTo(InstanceArraySymbol *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  char *in_stack_ffffffffffffffa8;
  undefined1 *__n;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  undefined1 local_40 [32];
  int local_20;
  void *local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __n = local_40;
  ConstantRange::toString_abi_cxx11_((ConstantRange *)in_stack_ffffffffffffffb0);
  ASTSerializer::write(in_RSI,local_20,local_18,(size_t)__n);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
  return;
}

Assistant:

void InstanceArraySymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("range", range.toString());
}